

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_do_write_interlace(png_row_infop row_info,png_bytep row,int pass)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  png_byte pVar6;
  uint uVar7;
  png_bytep ppVar8;
  byte bVar9;
  ulong __n;
  bool bVar10;
  
  if (5 < pass) {
    return;
  }
  bVar9 = row_info->pixel_depth;
  uVar2 = row_info->width;
  ppVar8 = row;
  if (bVar9 == 4) {
    bVar9 = ""[pass];
    uVar7 = (uint)bVar9;
    uVar3 = 0;
    if (bVar9 < uVar2) {
      bVar1 = "\b\b\x04\x04\x02\x02\x01"[pass];
      bVar9 = bVar9 * '\x04';
      iVar4 = 4;
      do {
        uVar3 = (row[uVar7 >> 1] >> (~bVar9 & 4) & 0xf) << ((byte)iVar4 & 0x1f) | uVar3;
        if (iVar4 == 0) {
          *ppVar8 = (png_byte)uVar3;
          ppVar8 = ppVar8 + 1;
          uVar3 = 0;
          iVar4 = 4;
        }
        else {
          iVar4 = iVar4 + -4;
        }
        pVar6 = (png_byte)uVar3;
        uVar7 = uVar7 + bVar1;
        bVar9 = bVar9 + bVar1 * '\x04';
      } while (uVar7 < uVar2);
      bVar10 = iVar4 == 4;
    }
    else {
LAB_00127051:
      pVar6 = '\0';
      bVar10 = true;
    }
  }
  else {
    if (bVar9 != 2) {
      if (bVar9 == 1) {
        uVar7 = (uint)""[pass];
        uVar3 = 0;
        pVar6 = '\0';
        if (""[pass] < uVar2) {
          bVar9 = "\b\b\x04\x04\x02\x02\x01"[pass];
          iVar4 = 7;
          do {
            uVar3 = (uint)((row[uVar7 >> 3] >> (~(byte)uVar7 & 7) & 1) != 0) << ((byte)iVar4 & 0x1f)
                    | uVar3;
            if (iVar4 == 0) {
              *ppVar8 = (png_byte)uVar3;
              ppVar8 = ppVar8 + 1;
              iVar4 = 7;
              uVar3 = 0;
            }
            else {
              iVar4 = iVar4 + -1;
            }
            pVar6 = (png_byte)uVar3;
            uVar7 = uVar7 + bVar9;
          } while (uVar7 < uVar2);
          bVar10 = iVar4 == 7;
          row = ppVar8;
        }
        else {
          bVar10 = true;
        }
        if (!bVar10) {
          *row = pVar6;
        }
      }
      else {
        uVar5 = (ulong)""[pass];
        if (""[pass] < uVar2) {
          __n = (ulong)(bVar9 >> 3);
          bVar9 = "\b\b\x04\x04\x02\x02\x01"[pass];
          do {
            if (ppVar8 != row + uVar5 * __n) {
              memcpy(ppVar8,row + uVar5 * __n,__n);
            }
            ppVar8 = ppVar8 + __n;
            uVar3 = (int)uVar5 + (uint)bVar9;
            uVar5 = (ulong)uVar3;
          } while (uVar3 < uVar2);
        }
      }
      goto LAB_001270ad;
    }
    bVar9 = ""[pass];
    uVar7 = (uint)bVar9;
    uVar3 = 0;
    if (uVar2 <= bVar9) goto LAB_00127051;
    bVar1 = "\b\b\x04\x04\x02\x02\x01"[pass];
    bVar9 = bVar9 * '\x02';
    iVar4 = 6;
    do {
      uVar3 = (row[uVar7 >> 2] >> (~bVar9 & 6) & 3) << ((byte)iVar4 & 0x1f) | uVar3;
      if (iVar4 == 0) {
        *ppVar8 = (png_byte)uVar3;
        ppVar8 = ppVar8 + 1;
        iVar4 = 6;
        uVar3 = 0;
      }
      else {
        iVar4 = iVar4 + -2;
      }
      pVar6 = (png_byte)uVar3;
      uVar7 = uVar7 + bVar1;
      bVar9 = bVar9 + bVar1 * '\x02';
    } while (uVar7 < uVar2);
    bVar10 = iVar4 == 6;
  }
  if (!bVar10) {
    *ppVar8 = pVar6;
  }
LAB_001270ad:
  uVar5 = (ulong)(~(uint)""[pass] + row_info->width + (uint)"\b\b\x04\x04\x02\x02\x01"[pass]) /
          (ulong)(uint)"\b\b\x04\x04\x02\x02\x01"[pass];
  row_info->width = (png_uint_32)uVar5;
  bVar9 = row_info->pixel_depth;
  if ((ulong)bVar9 < 8) {
    uVar5 = bVar9 * uVar5 + 7 >> 3;
  }
  else {
    uVar5 = (bVar9 >> 3) * uVar5;
  }
  row_info->rowbytes = uVar5;
  return;
}

Assistant:

void /* PRIVATE */
png_do_write_interlace(png_row_infop row_info, png_bytep row, int pass)
{
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */

   /* Start of interlace block */
   static const png_byte png_pass_start[7] = {0, 4, 0, 2, 0, 1, 0};

   /* Offset to next interlace block */
   static const png_byte png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   png_debug(1, "in png_do_write_interlace");

   /* We don't have to do anything on the last pass (6) */
   if (pass < 6)
   {
      /* Each pixel depth is handled separately */
      switch (row_info->pixel_depth)
      {
         case 1:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            d = 0;
            shift = 7;

            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 3);
               value = (int)(*sp >> (7 - (int)(i & 0x07))) & 0x01;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 7;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift--;

            }
            if (shift != 7)
               *dp = (png_byte)d;

            break;
         }

         case 2:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            shift = 6;
            d = 0;

            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 2);
               value = (*sp >> ((3 - (int)(i & 0x03)) << 1)) & 0x03;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 6;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift -= 2;
            }
            if (shift != 6)
               *dp = (png_byte)d;

            break;
         }

         case 4:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            shift = 4;
            d = 0;
            for (i = png_pass_start[pass]; i < row_width;
                i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 1);
               value = (*sp >> ((1 - (int)(i & 0x01)) << 2)) & 0x0f;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 4;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift -= 4;
            }
            if (shift != 4)
               *dp = (png_byte)d;

            break;
         }

         default:
         {
            png_bytep sp;
            png_bytep dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;
            size_t pixel_bytes;

            /* Start at the beginning */
            dp = row;

            /* Find out how many bytes each pixel takes up */
            pixel_bytes = (row_info->pixel_depth >> 3);

            /* Loop through the row, only looking at the pixels that matter */
            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               /* Find out where the original pixel is */
               sp = row + (size_t)i * pixel_bytes;

               /* Move the pixel */
               if (dp != sp)
                  memcpy(dp, sp, pixel_bytes);

               /* Next pixel */
               dp += pixel_bytes;
            }
            break;
         }
      }
      /* Set new row width */
      row_info->width = (row_info->width +
          png_pass_inc[pass] - 1 -
          png_pass_start[pass]) /
          png_pass_inc[pass];

      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth,
          row_info->width);
   }
}